

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqliteGenError(unqlite *pDb,char *zErr)

{
  char *pcVar1;
  sxi32 sVar2;
  char *pcVar3;
  
  pcVar3 = zErr;
  if (*zErr != '\0') {
    pcVar1 = zErr + 2;
    do {
      pcVar3 = pcVar1;
      if (pcVar3[-1] == '\0') {
        pcVar3 = pcVar3 + -1;
        goto LAB_0010d8ce;
      }
      if (*pcVar3 == '\0') goto LAB_0010d8ce;
      if (pcVar3[1] == '\0') {
        pcVar3 = pcVar3 + 1;
        goto LAB_0010d8ce;
      }
      pcVar1 = pcVar3 + 4;
    } while (pcVar3[2] != '\0');
    pcVar3 = pcVar3 + 2;
  }
LAB_0010d8ce:
  SyBlobAppend(&pDb->sErr,zErr,(int)pcVar3 - (int)zErr);
  sVar2 = SyBlobAppend(&pDb->sErr,"\n",1);
  return sVar2;
}

Assistant:

UNQLITE_PRIVATE int unqliteGenError(unqlite *pDb,const char *zErr)
{
	int rc;
	/* Append the error message */
	rc = SyBlobAppend(&pDb->sErr,(const void *)zErr,SyStrlen(zErr));
	/* Append a new line */
	SyBlobAppend(&pDb->sErr,(const void *)"\n",sizeof(char));
	return rc;
}